

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprListSetName(Parse *pParse,ExprList *pList,Token *pName,int dequote)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  undefined4 uVar4;
  char *z;
  RenameToken *pRVar5;
  ulong __n;
  
  if (pList != (ExprList *)0x0) {
    iVar1 = pList->nExpr;
    pcVar2 = pName->z;
    if (pcVar2 == (char *)0x0) {
      z = (char *)0x0;
    }
    else {
      __n = (ulong)pName->n;
      z = (char *)sqlite3DbMallocRawNN(pParse->db,__n + 1);
      if (z != (char *)0x0) {
        memcpy(z,pcVar2,__n);
        z[__n] = '\0';
      }
    }
    pList->a[(long)iVar1 + -1].zName = z;
    if (dequote != 0) {
      sqlite3Dequote(z);
    }
    if (1 < pParse->eParseMode) {
      pcVar2 = pList->a[(long)iVar1 + -1].zName;
      pRVar5 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20);
      if (pRVar5 != (RenameToken *)0x0) {
        pRVar5->p = pcVar2;
        uVar3 = pName->n;
        uVar4 = *(undefined4 *)&pName->field_0xc;
        (pRVar5->t).z = pName->z;
        (pRVar5->t).n = uVar3;
        *(undefined4 *)&(pRVar5->t).field_0xc = uVar4;
        pRVar5->pNext = pParse->pRename;
        pParse->pRename = pRVar5;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetName(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  Token *pName,           /* Name to be added */
  int dequote             /* True to cause the name to be dequoted */
){
  assert( pList!=0 || pParse->db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem;
    assert( pList->nExpr>0 );
    pItem = &pList->a[pList->nExpr-1];
    assert( pItem->zName==0 );
    pItem->zName = sqlite3DbStrNDup(pParse->db, pName->z, pName->n);
    if( dequote ) sqlite3Dequote(pItem->zName);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, (void*)pItem->zName, pName);
    }
  }
}